

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

cl_context
xmrig::OclLib::createContext
          (cl_context_properties *properties,cl_uint num_devices,cl_device_id *devices,
          _func_void_char_ptr_void_ptr_size_t_void_ptr *pfn_notify,void *user_data,
          cl_int *errcode_ret)

{
  char *fmt;
  char *pcVar1;
  _func_void_char_ptr_void_ptr_size_t_void_ptr *in_RCX;
  cl_device_id *in_RDX;
  cl_uint in_ESI;
  cl_context_properties *in_RDI;
  void *in_R8;
  cl_int *in_R9;
  cl_context result;
  cl_context local_8;
  
  local_8 = (*pCreateContext)(in_RDI,in_ESI,in_RDX,in_RCX,in_R8,in_R9);
  fmt = kErrorTemplate;
  if (*in_R9 != 0) {
    pcVar1 = OclError::toString(*in_R9);
    Log::print(ERR,fmt,pcVar1,kCreateContext);
    local_8 = (cl_context)0x0;
  }
  return local_8;
}

Assistant:

cl_context xmrig::OclLib::createContext(const cl_context_properties *properties, cl_uint num_devices, const cl_device_id *devices, void (CL_CALLBACK *pfn_notify)(const char *, const void *, size_t, void *), void *user_data, cl_int *errcode_ret)
{
    assert(pCreateContext != nullptr);

    auto result = pCreateContext(properties, num_devices, devices, pfn_notify, user_data, errcode_ret);
    if (*errcode_ret != CL_SUCCESS) {
        LOG_ERR(kErrorTemplate, OclError::toString(*errcode_ret), kCreateContext);

        return nullptr;
    }

    return result;
}